

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O2

size_t HUF_buildCTable_wksp
                 (HUF_CElt *CTable,uint *count,U32 maxSymbolValue,U32 maxNbBits,void *workSpace,
                 size_t wkspSize)

{
  char *pcVar1;
  byte bVar2;
  byte bVar3;
  short sVar4;
  short sVar5;
  ushort uVar6;
  int pos;
  U32 UVar7;
  uint uVar8;
  U32 UVar9;
  undefined4 *__s;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  byte bVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  int iVar24;
  ulong uVar25;
  HUF_CElt *elt;
  nodeElt *huffNode0;
  uint uVar26;
  bool bVar27;
  size_t sStack_c0;
  U16 nbPerRank [13];
  ushort auStack_58 [16];
  size_t wkspSize_local;
  
  wkspSize_local = wkspSize;
  __s = (undefined4 *)HUF_alignUpWorkspace(workSpace,&wkspSize_local,4);
  if (wkspSize_local < 0x1300) {
    sStack_c0 = 0xffffffffffffffbe;
  }
  else if (maxSymbolValue < 0x100) {
    uVar16 = (ulong)(maxSymbolValue + 1);
    memset(__s,0,0x1300);
    for (uVar25 = 0; uVar16 != uVar25; uVar25 = uVar25 + 1) {
      UVar7 = HUF_getIndex(count[uVar25]);
      *(short *)(__s + (ulong)UVar7 + 0x400) = *(short *)(__s + (ulong)UVar7 + 0x400) + 1;
    }
    uVar8 = 0xb;
    if (maxNbBits != 0) {
      uVar8 = maxNbBits;
    }
    if (*(short *)(__s + 0x4bf) != 0) {
      __assert_fail("rankPosition[RANK_POSITION_TABLE_SIZE - 1].base == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                    ,0x264,"void HUF_sort(nodeElt *, const unsigned int *, const U32, rankPos *)");
    }
    for (lVar10 = 0x4bf; lVar10 != 0x400; lVar10 = lVar10 + -1) {
      uVar25 = (ulong)((int)lVar10 - 0x401);
      sVar4 = *(short *)(__s + uVar25 + 0x400);
      sVar5 = *(short *)(__s + lVar10);
      *(short *)(__s + uVar25 + 0x400) = sVar4 + sVar5;
      *(short *)((long)__s + uVar25 * 4 + 0x1002) = sVar4 + sVar5;
    }
    for (uVar25 = 0; uVar16 != uVar25; uVar25 = uVar25 + 1) {
      UVar7 = count[uVar25];
      UVar9 = HUF_getIndex(UVar7);
      uVar6 = *(ushort *)((long)__s + (ulong)UVar9 * 4 + 0x1006);
      *(ushort *)((long)__s + (ulong)UVar9 * 4 + 0x1006) = uVar6 + 1;
      if ((ushort)maxSymbolValue < uVar6) {
        __assert_fail("pos < maxSymbolValue1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                      ,0x270,"void HUF_sort(nodeElt *, const unsigned int *, const U32, rankPos *)")
        ;
      }
      __s[(ulong)uVar6 * 2 + 2] = UVar7;
      *(char *)((long)__s + (ulong)uVar6 * 8 + 0xe) = (char)uVar25;
    }
    for (lVar10 = 0x4a5; lVar10 != 0x4bf; lVar10 = lVar10 + 1) {
      uVar6 = *(ushort *)(__s + lVar10);
      iVar19 = (uint)*(ushort *)((long)__s + lVar10 * 4 + 2) - (uint)uVar6;
      if (1 < iVar19) {
        if (maxSymbolValue < uVar6) {
          __assert_fail("bucketStartIdx < maxSymbolValue1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                        ,0x27a,
                        "void HUF_sort(nodeElt *, const unsigned int *, const U32, rankPos *)");
        }
        HUF_simpleQuickSort((nodeElt *)(__s + (ulong)uVar6 * 2 + 2),0,iVar19 + -1);
      }
    }
    uVar25 = 1;
    while (uVar16 != uVar25) {
      lVar10 = uVar25 * 2;
      lVar17 = uVar25 * 2;
      uVar25 = uVar25 + 1;
      if ((uint)__s[lVar17] < (uint)__s[lVar10 + 2]) {
        __assert_fail("HUF_isSorted(huffNode, maxSymbolValue1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                      ,0x27f,"void HUF_sort(nodeElt *, const unsigned int *, const U32, rankPos *)")
        ;
      }
    }
    uVar16 = (ulong)maxSymbolValue;
    uVar25 = uVar16 + 1;
    lVar10 = (uVar16 << 0x20) + 0x10000000000;
    uVar26 = maxSymbolValue + 0xff;
    do {
      uVar20 = uVar26;
      lVar10 = lVar10 + -0x100000000;
      lVar17 = uVar25 * 2;
      uVar25 = uVar25 - 1;
      uVar26 = uVar20 - 1;
    } while (__s[lVar17] == 0);
    __s[0x202] = __s[lVar17] + __s[uVar25 * 2];
    *(undefined2 *)(__s + uVar25 * 2 + 1) = 0x100;
    *(undefined2 *)(__s + uVar25 * 2 + 3) = 0x100;
    lVar10 = lVar10 >> 0x20;
    for (lVar17 = 0x101; lVar17 <= lVar10; lVar17 = lVar17 + 1) {
      __s[lVar17 * 2 + 2] = 0x40000000;
    }
    iVar19 = uVar20 - 0x101;
    *__s = 0x80000000;
    iVar22 = 0x100;
    for (lVar17 = 0x101; lVar17 <= lVar10; lVar17 = lVar17 + 1) {
      uVar20 = __s[(long)iVar19 * 2 + 2];
      uVar23 = __s[(long)iVar22 * 2 + 2];
      iVar21 = (iVar22 + 1) - (uint)(uVar20 < uVar23);
      iVar15 = iVar22;
      if (uVar20 < uVar23) {
        iVar15 = iVar19;
      }
      uVar14 = (uint)(uVar20 < uVar23);
      iVar24 = iVar19 - uVar14;
      uVar20 = __s[(long)iVar24 * 2 + 2];
      uVar23 = __s[(long)iVar21 * 2 + 2];
      iVar22 = (iVar21 + 1) - (uint)(uVar20 < uVar23);
      iVar19 = (iVar19 - uVar14) - (uint)(uVar20 < uVar23);
      if (uVar20 < uVar23) {
        iVar21 = iVar24;
      }
      __s[lVar17 * 2 + 2] = __s[(long)iVar21 * 2 + 2] + __s[(long)iVar15 * 2 + 2];
      *(short *)(__s + (long)iVar21 * 2 + 3) = (short)lVar17;
      *(short *)(__s + (long)iVar15 * 2 + 3) = (short)lVar17;
    }
    *(undefined1 *)((long)__s + lVar10 * 8 + 0xf) = 0;
    for (uVar11 = (ulong)uVar26; 0xff < (int)uVar11; uVar11 = uVar11 - 1) {
      *(char *)((long)__s + uVar11 * 8 + 0xf) =
           *(char *)((long)__s + (ulong)*(ushort *)(__s + uVar11 * 2 + 3) * 8 + 0xf) + '\x01';
    }
    iVar19 = (int)uVar25;
    lVar10 = (long)iVar19;
    if ((long)iVar19 < 0) {
      lVar10 = -1;
    }
    for (lVar17 = 0; lVar10 + 1 != lVar17; lVar17 = lVar17 + 1) {
      *(char *)((long)__s + lVar17 * 8 + 0xf) =
           *(char *)((long)__s + (ulong)*(ushort *)(__s + lVar17 * 2 + 3) * 8 + 0xf) + '\x01';
    }
    bVar2 = *(byte *)((long)__s + (uVar25 & 0xffffffff) * 8 + 0xf);
    iVar22 = bVar2 - uVar8;
    uVar26 = (uint)bVar2;
    if (uVar8 <= bVar2 && iVar22 != 0) {
      bVar13 = (byte)iVar22;
      iVar22 = 1 << (bVar13 & 0x1f);
      uVar25 = (long)iVar19 + 1;
      uVar26 = 0;
      while (bVar3 = *(byte *)((long)__s + uVar25 * 8 + 7), uVar8 < bVar3) {
        uVar26 = uVar26 + iVar22 + (-1 << (bVar2 - bVar3 & 0x1f));
        *(char *)((long)__s + uVar25 * 8 + 7) = (char)uVar8;
        uVar25 = uVar25 - 1;
      }
      do {
        lVar10 = uVar25 * 8;
        uVar25 = uVar25 - 1;
      } while (uVar8 == *(byte *)((long)__s + lVar10 + 7));
      if ((uVar26 & iVar22 - 1U) != 0) {
        __assert_fail("((U32)totalCost & (baseCost - 1)) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                      ,0x17c,"U32 HUF_setMaxHeight(nodeElt *, U32, U32)");
      }
      UVar7 = (int)uVar26 >> (bVar13 & 0x1f);
      if ((int)UVar7 < 1) {
        __assert_fail("totalCost > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                      ,0x17e,"U32 HUF_setMaxHeight(nodeElt *, U32, U32)");
      }
      nbPerRank[8] = 0xf0f0;
      nbPerRank[9] = 0xf0f0;
      nbPerRank[10] = 0xf0f0;
      nbPerRank[0xb] = 0xf0f0;
      nbPerRank[0xc] = 0xf0f0;
      nbPerRank[0] = 0xf0f0;
      nbPerRank[1] = 0xf0f0;
      nbPerRank[2] = 0xf0f0;
      nbPerRank[3] = 0xf0f0;
      nbPerRank[4] = 0xf0f0;
      nbPerRank[5] = 0xf0f0;
      nbPerRank[6] = 0xf0f0;
      nbPerRank[7] = 0xf0f0;
      uVar11 = uVar25 & 0xffffffff;
      uVar26 = uVar8;
      while (iVar22 = (int)uVar11, -1 < iVar22) {
        bVar2 = *(byte *)((long)__s + uVar11 * 8 + 0xf);
        if (bVar2 < uVar26) {
          uVar26 = (uint)bVar2;
          *(int *)(nbPerRank + (ulong)(uVar8 - uVar26) * 2) = iVar22;
        }
        uVar11 = (ulong)(iVar22 - 1);
      }
      do {
        if ((int)UVar7 < 1) {
          uVar20 = nbPerRank._4_4_;
          do {
            iVar22 = uVar20 + 0xf0f0f10;
            iVar15 = 0;
            UVar9 = UVar7;
            while( true ) {
              uVar20 = uVar20 + 1;
              uVar26 = uVar8;
              if (-1 < (int)UVar9) goto LAB_005f71e8;
              if (iVar22 == iVar15) break;
              pcVar1 = (char *)((long)__s + (ulong)uVar20 * 8 + 0xf);
              *pcVar1 = *pcVar1 + -1;
              UVar9 = UVar9 + 1;
              iVar15 = iVar15 + -1;
            }
            iVar22 = (int)uVar25;
            uVar25 = (long)iVar22 + 1;
            uVar20 = iVar22 + 2;
            do {
              lVar10 = uVar25 * 8;
              uVar25 = uVar25 - 1;
              uVar20 = uVar20 - 1;
            } while (uVar8 == *(byte *)((long)__s + lVar10 + 7));
            pcVar1 = (char *)((long)__s + (long)(int)uVar20 * 8 + 0xf);
            *pcVar1 = *pcVar1 + -1;
            UVar7 = (UVar7 - iVar15) + 1;
            if ((long)uVar25 < 0) {
              __assert_fail("n >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                            ,0x1cc,"U32 HUF_setMaxHeight(nodeElt *, U32, U32)");
            }
          } while( true );
        }
        uVar26 = ZSTD_highbit32(UVar7);
        for (uVar11 = (ulong)(uVar26 + 1); 1 < uVar11; uVar11 = uVar11 - 1) {
          if (((ulong)*(uint *)(nbPerRank + uVar11 * 2) != 0xf0f0f0f0) &&
             ((*(uint *)(nbPerRank + uVar11 * 2 + -2) == 0xf0f0f0f0 ||
              ((uint)__s[(ulong)*(uint *)(nbPerRank + uVar11 * 2) * 2 + 2] <=
               (uint)(__s[(ulong)*(uint *)(nbPerRank + uVar11 * 2 + -2) * 2 + 2] * 2)))))
          goto LAB_005f70cd;
        }
        uVar11 = 1;
LAB_005f70cd:
        uVar18 = uVar11 & 0xffffffff;
        if (((uint)uVar11 != 1) && (*(int *)(nbPerRank + uVar18 * 2) == -0xf0f0f10)) {
          __assert_fail("rankLast[nBitsToDecrease] != noSymbol || nBitsToDecrease == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                        ,0x1a0,"U32 HUF_setMaxHeight(nodeElt *, U32, U32)");
        }
        uVar12 = 0xd;
        if (0xd < (uint)uVar11) {
          uVar12 = uVar11 & 0xffffffff;
        }
        for (; uVar26 = (uint)uVar12, uVar18 < 0xd; uVar18 = uVar18 + 1) {
          if (*(int *)(nbPerRank + uVar18 * 2) != -0xf0f0f10) {
            uVar26 = (uint)uVar18;
            break;
          }
        }
        uVar20 = *(uint *)(nbPerRank + (ulong)uVar26 * 2);
        uVar11 = (ulong)uVar20;
        if (uVar11 == 0xf0f0f0f0) {
          __assert_fail("rankLast[nBitsToDecrease] != noSymbol",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                        ,0x1a4,"U32 HUF_setMaxHeight(nodeElt *, U32, U32)");
        }
        uVar14 = uVar26 - 1;
        pcVar1 = (char *)((long)__s + uVar11 * 8 + 0xf);
        *pcVar1 = *pcVar1 + '\x01';
        uVar23 = uVar20;
        if (*(uint *)(nbPerRank + (ulong)uVar14 * 2) != 0xf0f0f0f0) {
          uVar23 = *(uint *)(nbPerRank + (ulong)uVar14 * 2);
        }
        *(uint *)(nbPerRank + (ulong)uVar14 * 2) = uVar23;
        if (uVar11 == 0) {
          uVar20 = 0xf0f0f0f0;
        }
        else {
          uVar20 = uVar20 - 1;
          if (uVar8 - uVar26 != (uint)*(byte *)((long)__s + (ulong)uVar20 * 8 + 0xf)) {
            uVar20 = 0xf0f0f0f0;
          }
        }
        UVar7 = UVar7 + (-1 << ((byte)uVar14 & 0x1f));
        *(uint *)(nbPerRank + (ulong)uVar26 * 2) = uVar20;
      } while( true );
    }
LAB_005f71e8:
    sStack_c0 = 0xffffffffffffffff;
    if (uVar26 < 0xd) {
      nbPerRank[8] = 0;
      nbPerRank[9] = 0;
      nbPerRank[10] = 0;
      nbPerRank[0xb] = 0;
      nbPerRank[0xc] = 0;
      nbPerRank[0] = 0;
      nbPerRank[1] = 0;
      nbPerRank[2] = 0;
      nbPerRank[3] = 0;
      nbPerRank[4] = 0;
      nbPerRank[5] = 0;
      nbPerRank[6] = 0;
      nbPerRank[7] = 0;
      auStack_58[8] = 0;
      auStack_58[9] = 0;
      auStack_58[10] = 0;
      auStack_58[0xb] = 0;
      auStack_58[0xc] = 0;
      auStack_58[0] = 0;
      auStack_58[1] = 0;
      auStack_58[2] = 0;
      auStack_58[3] = 0;
      auStack_58[4] = 0;
      auStack_58[5] = 0;
      auStack_58[6] = 0;
      auStack_58[7] = 0;
      lVar10 = -1;
      if (-1 < (long)iVar19) {
        lVar10 = (long)iVar19;
      }
      for (lVar17 = 0; lVar10 + 1 != lVar17; lVar17 = lVar17 + 1) {
        nbPerRank[*(byte *)((long)__s + lVar17 * 8 + 0xf)] =
             nbPerRank[*(byte *)((long)__s + lVar17 * 8 + 0xf)] + 1;
      }
      uVar6 = 0;
      sStack_c0 = (size_t)uVar26;
      for (uVar25 = sStack_c0; 0 < (long)uVar25; uVar25 = uVar25 - 1) {
        auStack_58[uVar25] = uVar6;
        uVar6 = (ushort)(uVar6 + nbPerRank[uVar25]) >> 1;
      }
      elt = CTable + 1;
      lVar17 = uVar16 + 1;
      for (lVar10 = 0; lVar17 != lVar10; lVar10 = lVar10 + 1) {
        HUF_setNbBits(elt + *(byte *)((long)__s + lVar10 * 8 + 0xe),
                      (ulong)*(byte *)((long)__s + lVar10 * 8 + 0xf));
      }
      while (bVar27 = lVar17 != 0, lVar17 = lVar17 + -1, bVar27) {
        uVar6 = auStack_58[(byte)*elt];
        auStack_58[(byte)*elt] = uVar6 + 1;
        HUF_setValue(elt,(ulong)uVar6);
        elt = elt + 1;
      }
      *CTable = sStack_c0;
    }
  }
  else {
    sStack_c0 = 0xffffffffffffffd2;
  }
  return sStack_c0;
}

Assistant:

size_t
HUF_buildCTable_wksp(HUF_CElt* CTable, const unsigned* count, U32 maxSymbolValue, U32 maxNbBits,
                     void* workSpace, size_t wkspSize)
{
    HUF_buildCTable_wksp_tables* const wksp_tables =
        (HUF_buildCTable_wksp_tables*)HUF_alignUpWorkspace(workSpace, &wkspSize, ZSTD_ALIGNOF(U32));
    nodeElt* const huffNode0 = wksp_tables->huffNodeTbl;
    nodeElt* const huffNode = huffNode0+1;
    int nonNullRank;

    HUF_STATIC_ASSERT(HUF_CTABLE_WORKSPACE_SIZE == sizeof(HUF_buildCTable_wksp_tables));

    DEBUGLOG(5, "HUF_buildCTable_wksp (alphabet size = %u)", maxSymbolValue+1);

    /* safety checks */
    if (wkspSize < sizeof(HUF_buildCTable_wksp_tables))
        return ERROR(workSpace_tooSmall);
    if (maxNbBits == 0) maxNbBits = HUF_TABLELOG_DEFAULT;
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX)
        return ERROR(maxSymbolValue_tooLarge);
    ZSTD_memset(huffNode0, 0, sizeof(huffNodeTable));

    /* sort, decreasing order */
    HUF_sort(huffNode, count, maxSymbolValue, wksp_tables->rankPosition);
    DEBUGLOG(6, "sorted symbols completed (%zu symbols)", showHNodeSymbols(huffNode, maxSymbolValue+1));

    /* build tree */
    nonNullRank = HUF_buildTree(huffNode, maxSymbolValue);

    /* determine and enforce maxTableLog */
    maxNbBits = HUF_setMaxHeight(huffNode, (U32)nonNullRank, maxNbBits);
    if (maxNbBits > HUF_TABLELOG_MAX) return ERROR(GENERIC);   /* check fit into table */

    HUF_buildCTableFromTree(CTable, huffNode, nonNullRank, maxSymbolValue, maxNbBits);

    return maxNbBits;
}